

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_test.cc
# Opt level: O2

int main(int argc,char **argv)

{
  TestSuite test;
  allocator local_c9;
  string local_c8;
  code *local_a8 [2];
  code *local_98;
  code *local_90;
  code *local_88 [2];
  code *local_78;
  code *local_70;
  TestSuite local_68;
  
  TestSuite::TestSuite(&local_68,argc,argv);
  local_68.options.printTestMessage = true;
  std::__cxx11::string::string((string *)&local_c8,"multi thread test",&local_c9);
  local_88[1] = (code *)0x0;
  local_88[0] = MT_basic_insert_test;
  local_70 = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_78 = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_68,&local_c8,(test_func *)local_88);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string((string *)&local_c8,"function latency macro test",&local_c9);
  local_a8[1] = (code *)0x0;
  local_a8[0] = latency_macro_test;
  local_90 = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_98 = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  TestSuite::doTest(&local_68,&local_c8,(test_func *)local_a8);
  std::_Function_base::~_Function_base((_Function_base *)local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  TestSuite::~TestSuite(&local_68);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    TestSuite test(argc, argv);;

    test.options.printTestMessage = true;
    test.doTest("multi thread test", MT_basic_insert_test);
    test.doTest("function latency macro test", latency_macro_test);

    return 0;
}